

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

PropertyRecord * __thiscall
ThreadContext::FindPropertyRecord(ThreadContext *this,char16 *propertyName,int propertyNameLength)

{
  BaseHashSet<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  PropertyRecord *pPVar4;
  undefined4 *puVar5;
  PropertyRecord **ppPVar6;
  HashedCharacterBuffer<char16_t> local_30;
  
  if (propertyNameLength < 2) {
    if (propertyNameLength == 1) {
      if ((ulong)(ushort)*propertyName < 0x80) {
        pPVar4 = this->propertyNamesDirect[(ushort)*propertyName];
        pBVar1 = this->propertyMap;
        Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer(&local_30,propertyName,1);
        ppPVar6 = JsUtil::
                  BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                  ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_30);
        if (pPVar4 == *ppPVar6) {
          return pPVar4;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x381,
                           "(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)))"
                           ,
                           "propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength))"
                          );
        if (bVar3) {
          *puVar5 = 0;
          return pPVar4;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    else if (propertyNameLength == 0) {
      pPVar4 = GetEmptyStringPropertyRecord(this);
      return pPVar4;
    }
  }
  pBVar1 = this->propertyMap;
  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
            (&local_30,propertyName,propertyNameLength);
  ppPVar6 = JsUtil::
            BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
            ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_30);
  return *ppPVar6;
}

Assistant:

const Js::PropertyRecord *
ThreadContext::FindPropertyRecord(const char16 * propertyName, int propertyNameLength)
{
    // IsDirectPropertyName == 1 char properties && GetEmptyStringPropertyRecord == 0 length
    if (propertyNameLength < 2)
    {
        if (propertyNameLength == 0)
        {
            return this->GetEmptyStringPropertyRecord();
        }

    if (IsDirectPropertyName(propertyName, propertyNameLength))
    {
            Js::PropertyRecord const * propertyRecord = propertyNamesDirect[propertyName[0]];
        Assert(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)));
            return propertyRecord;
    }
    }

    return propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength));
}